

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-lattices.cpp
# Opt level: O1

void __thiscall
wasm::RandomElement<wasm::RandomFullLattice>::RandomElement
          (RandomElement<wasm::RandomFullLattice> *this,
          RandomElement<wasm::RandomFullLattice> *other)

{
  _Variant_storage<false,_bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
  *this_00;
  _Move_ctor_base<false,_bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
  *this_01;
  undefined1 local_70 [8];
  ElementImpl copy;
  
  std::__detail::__variant::
  _Copy_ctor_base<false,_bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
                     *)local_70,
                    (_Copy_ctor_base<false,_bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
                     *)(other->super_unique_ptr<void,_void_(*)(void_*)>)._M_t.
                       super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                       super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                       super__Head_base<0UL,_void_*,_false>._M_head_impl);
  std::__detail::__variant::
  _Move_ctor_base<false,_bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
  ::_Move_ctor_base((_Move_ctor_base<false,_bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
                     *)((long)&copy.super_FullLatticeElementVariant.
                               super__Variant_base<bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
                               .
                               super__Move_assign_alias<bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
                               .
                               super__Copy_assign_alias<bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
                               .
                               super__Move_ctor_alias<bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
                               .
                               super__Copy_ctor_alias<bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
                       + 0x20),
                    (_Move_ctor_base<false,_bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
                     *)local_70);
  std::__detail::__variant::
  _Variant_storage<false,_bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
  ::~_Variant_storage((_Variant_storage<false,_bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
                       *)local_70);
  this_01 = (_Move_ctor_base<false,_bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
             *)operator_new(0x28);
  this_00 = (_Variant_storage<false,_bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
             *)((long)&copy.super_FullLatticeElementVariant.
                       super__Variant_base<bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
                       .
                       super__Move_assign_alias<bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
                       .
                       super__Copy_assign_alias<bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
                       .
                       super__Move_ctor_alias<bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
                       .
                       super__Copy_ctor_alias<bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
               + 0x20);
  std::__detail::__variant::
  _Move_ctor_base<false,_bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
  ::_Move_ctor_base(this_01,(_Move_ctor_base<false,_bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
                             *)this_00);
  (this->super_unique_ptr<void,_void_(*)(void_*)>)._M_t.
  super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.super__Tuple_impl<1UL,_void_(*)(void_*)>.
  super__Head_base<1UL,_void_(*)(void_*),_false> =
       (_Head_base<1UL,_void_(*)(void_*),_false>)RandomElement::anon_class_1_0_00000001::__invoke;
  (this->super_unique_ptr<void,_void_(*)(void_*)>)._M_t.
  super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.super__Head_base<0UL,_void_*,_false>._M_head_impl
       = this_01;
  std::__detail::__variant::
  _Variant_storage<false,_bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
  ::~_Variant_storage(this_00);
  return;
}

Assistant:

RandomElement(const RandomElement& other)
    : RandomElement([&]() {
        auto copy = *other;
        return copy;
      }()) {}